

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void RescalerExportRowExpand_SSE2(WebPRescaler *wrk)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  long lVar3;
  long in_RDI;
  int v_1;
  uint32_t J_1;
  uint64_t I;
  __m128i E3;
  __m128i E2;
  __m128i E1;
  __m128i E0;
  __m128i D3;
  __m128i D2;
  __m128i D1;
  __m128i D0;
  __m128i C3;
  __m128i C2;
  __m128i C1;
  __m128i C0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i A3_1;
  __m128i A2_1;
  __m128i A1_1;
  __m128i A0_1;
  __m128i rounder;
  __m128i mB;
  __m128i mA;
  uint32_t A;
  uint32_t B;
  int v;
  uint32_t J;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  __m128i mult;
  rescaler_t *frow;
  int x_out_max;
  rescaler_t *irow;
  uint8_t *dst;
  int x_out;
  undefined1 local_420;
  undefined1 local_41c;
  uint8_t *in_stack_fffffffffffffc70;
  __m128i *in_stack_fffffffffffffc78;
  __m128i *in_stack_fffffffffffffc80;
  __m128i *in_stack_fffffffffffffc88;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  long local_348;
  long lStack_340;
  long local_338;
  long lStack_330;
  long local_328;
  long lStack_320;
  long local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  long local_2f8;
  long lStack_2f0;
  long local_2e8;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  long local_2c8;
  long lStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  uint local_298;
  uint local_294;
  longlong local_288 [2];
  longlong local_278 [2];
  longlong local_268 [2];
  longlong local_258 [2];
  ulong local_248;
  ulong uStack_240;
  long local_238;
  int local_22c;
  long local_228;
  long local_220;
  int local_214;
  long local_210;
  long local_208;
  long lStack_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  ulong local_1e8;
  ulong uStack_1e0;
  uint local_1d8;
  undefined4 local_1d4;
  uint local_1d0;
  undefined4 local_1cc;
  ulong local_1c8;
  ulong uStack_1c0;
  uint local_1b8;
  undefined4 local_1b4;
  uint local_1b0;
  undefined4 local_1ac;
  ulong local_1a8;
  ulong uStack_1a0;
  uint local_18c;
  undefined4 local_188;
  uint local_184;
  undefined4 local_180;
  undefined4 local_17c;
  long local_178;
  long lStack_170;
  undefined4 local_15c;
  long local_158;
  long lStack_150;
  undefined4 local_13c;
  long local_138;
  long lStack_130;
  undefined4 local_11c;
  long local_118;
  uint8_t *puStack_110;
  long local_108;
  long lStack_100;
  __m128i *local_f8;
  __m128i *palStack_f0;
  long local_e8;
  long lStack_e0;
  __m128i *local_d8;
  __m128i *palStack_d0;
  long local_c8;
  long lStack_c0;
  __m128i *local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  long lStack_30;
  long local_28;
  long lStack_20;
  long local_18;
  long lStack_10;
  
  local_220 = *(long *)(in_RDI + 0x48);
  local_228 = *(long *)(in_RDI + 0x58);
  local_22c = *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 8);
  local_238 = *(long *)(in_RDI + 0x60);
  local_18c = *(uint *)(in_RDI + 0x10);
  local_180 = 0;
  local_188 = 0;
  local_248 = (ulong)local_18c;
  uStack_240 = (ulong)local_18c;
  local_210 = in_RDI;
  local_1a8 = local_248;
  uStack_1a0 = uStack_240;
  local_184 = local_18c;
  if (*(int *)(in_RDI + 0x18) == 0) {
    for (local_214 = 0; local_214 + 8 <= local_22c; local_214 = local_214 + 8) {
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_238 + (long)local_214 * 4),(__m128i *)0x0,&local_258,
                 &local_268,&local_278,&local_288);
      ProcessRow_SSE2(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                      in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70)
      ;
    }
    for (; local_214 < local_22c; local_214 = local_214 + 1) {
      lVar3 = (ulong)*(uint *)(local_238 + (long)local_214 * 4) * (ulong)*(uint *)(local_210 + 0x10)
              + 0x80000000;
      if ((int)((ulong)lVar3 >> 0x20) < 0x100) {
        local_41c = (undefined1)((ulong)lVar3 >> 0x20);
      }
      else {
        local_41c = 0xff;
      }
      *(undefined1 *)(local_220 + local_214) = local_41c;
    }
  }
  else {
    auVar1._8_4_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 0x20);
    auVar2._4_8_ = 0;
    auVar2._0_4_ = -*(int *)(in_RDI + 0x18);
    local_294 = SUB124((auVar2 << 0x20) / auVar1,0);
    local_298 = -local_294;
    local_1ac = 0;
    local_1b4 = 0;
    local_2a8 = (ulong)local_298;
    uStack_2a0 = (ulong)local_298;
    local_1cc = 0;
    local_1d4 = 0;
    local_2b8 = (ulong)local_294;
    uStack_2b0 = (ulong)local_294;
    local_1ec = 0;
    local_1f0 = 0x80000000;
    local_1f4 = 0;
    local_1f8 = 0x80000000;
    local_2c8 = 0x80000000;
    lStack_2c0 = 0x80000000;
    local_208 = local_2c8;
    lStack_200 = lStack_2c0;
    local_1e8 = local_2b8;
    uStack_1e0 = uStack_2b0;
    local_1d8 = local_294;
    local_1d0 = local_294;
    local_1c8 = local_2a8;
    uStack_1c0 = uStack_2a0;
    local_1b8 = local_298;
    local_1b0 = local_298;
    for (local_214 = 0; local_214 + 8 <= local_22c; local_214 = local_214 + 8) {
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_238 + (long)local_214 * 4),(__m128i *)&local_2a8,
                 (__m128i *)&local_2d8,(__m128i *)&local_2e8,(__m128i *)&local_2f8,
                 (__m128i *)&local_308);
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_228 + (long)local_214 * 4),(__m128i *)&local_2b8,
                 (__m128i *)&local_318,(__m128i *)&local_328,(__m128i *)&local_338,
                 (__m128i *)&local_348);
      local_18 = local_2d8;
      lStack_10 = lStack_2d0;
      local_28 = local_318;
      lStack_20 = lStack_310;
      local_98 = local_2d8 + local_318;
      lStack_90 = lStack_2d0 + lStack_310;
      local_38 = local_2e8;
      lStack_30 = lStack_2e0;
      local_48 = local_328;
      lStack_40 = lStack_320;
      local_b8 = (__m128i *)(local_2e8 + local_328);
      lStack_b0 = lStack_2e0 + lStack_320;
      local_58 = local_2f8;
      lStack_50 = lStack_2f0;
      local_68 = local_338;
      lStack_60 = lStack_330;
      local_d8 = (__m128i *)(local_2f8 + local_338);
      palStack_d0 = (__m128i *)(lStack_2f0 + lStack_330);
      local_78 = local_308;
      lStack_70 = lStack_300;
      local_88 = local_348;
      lStack_80 = lStack_340;
      local_f8 = (__m128i *)(local_308 + local_348);
      palStack_f0 = (__m128i *)(lStack_300 + lStack_340);
      local_a8 = local_2c8;
      lStack_a0 = lStack_2c0;
      local_118 = local_98 + local_2c8;
      puStack_110 = (uint8_t *)(lStack_90 + lStack_2c0);
      local_c8 = local_2c8;
      lStack_c0 = lStack_2c0;
      local_138 = (long)*local_b8 + local_2c8;
      lStack_130 = lStack_b0 + lStack_2c0;
      local_e8 = local_2c8;
      lStack_e0 = lStack_2c0;
      local_158 = (long)*local_d8 + local_2c8;
      lStack_150 = (long)*palStack_d0 + lStack_2c0;
      local_108 = local_2c8;
      lStack_100 = lStack_2c0;
      local_178 = (long)*local_f8 + local_2c8;
      lStack_170 = (long)*palStack_f0 + lStack_2c0;
      local_11c = 0x20;
      local_13c = 0x20;
      local_15c = 0x20;
      local_17c = 0x20;
      ProcessRow_SSE2(local_b8,palStack_d0,local_d8,palStack_f0,local_f8,puStack_110);
    }
    for (; local_214 < local_22c; local_214 = local_214 + 1) {
      lVar3 = ((ulong)local_298 * (ulong)*(uint *)(local_238 + (long)local_214 * 4) +
               (ulong)local_294 * (ulong)*(uint *)(local_228 + (long)local_214 * 4) + 0x80000000 >>
              0x20) * (ulong)*(uint *)(local_210 + 0x10) + 0x80000000;
      if ((int)((ulong)lVar3 >> 0x20) < 0x100) {
        local_420 = (undefined1)((ulong)lVar3 >> 0x20);
      }
      else {
        local_420 = 0xff;
      }
      *(undefined1 *)(local_220 + local_214) = local_420;
    }
  }
  return;
}

Assistant:

static void RescalerExportRowExpand_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const __m128i mult = _mm_set_epi32(0, wrk->fy_scale, 0, wrk->fy_scale);

  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0 && wrk->y_sub + wrk->y_accum >= 0);
  assert(wrk->y_expand);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(frow + x_out, NULL, &A0, &A1, &A2, &A3);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    const __m128i mA = _mm_set_epi32(0, A, 0, A);
    const __m128i mB = _mm_set_epi32(0, B, 0, B);
    const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(frow + x_out, &mA, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(irow + x_out, &mB, &B0, &B1, &B2, &B3);
      {
        const __m128i C0 = _mm_add_epi64(A0, B0);
        const __m128i C1 = _mm_add_epi64(A1, B1);
        const __m128i C2 = _mm_add_epi64(A2, B2);
        const __m128i C3 = _mm_add_epi64(A3, B3);
        const __m128i D0 = _mm_add_epi64(C0, rounder);
        const __m128i D1 = _mm_add_epi64(C1, rounder);
        const __m128i D2 = _mm_add_epi64(C2, rounder);
        const __m128i D3 = _mm_add_epi64(C3, rounder);
        const __m128i E0 = _mm_srli_epi64(D0, WEBP_RESCALER_RFIX);
        const __m128i E1 = _mm_srli_epi64(D1, WEBP_RESCALER_RFIX);
        const __m128i E2 = _mm_srli_epi64(D2, WEBP_RESCALER_RFIX);
        const __m128i E3 = _mm_srli_epi64(D3, WEBP_RESCALER_RFIX);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}